

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O2

void Test_TemplateModifiers_JsonEscape::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  int iVar9;
  char *pcVar10;
  TemplateDictionaryPeer peer;
  TemplateString local_198;
  TemplateString local_178;
  TemplateString local_158;
  TemplateString local_138;
  TemplateString local_118;
  TemplateString local_f8;
  TemplateString local_d8;
  TemplateString local_b8;
  TemplateString local_98;
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_198,"TestJsonEscape");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_198,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_98,"easy JSON");
  ctemplate::TemplateString::TemplateString(&local_b8,"joo");
  TVar1.length_ = local_98.length_;
  TVar1.ptr_ = local_98.ptr_;
  TVar1.is_immutable_ = local_98.is_immutable_;
  TVar1._17_7_ = local_98._17_7_;
  TVar1.id_ = local_98.id_;
  TVar5.length_ = local_b8.length_;
  TVar5.ptr_ = local_b8.ptr_;
  TVar5.is_immutable_ = local_b8.is_immutable_;
  TVar5._17_7_ = local_b8._17_7_;
  TVar5.id_ = local_b8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar1,TVar5,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_d8,"harder JSON");
  ctemplate::TemplateString::TemplateString(&local_f8,"f = \"joo\"; e = \'joo\';");
  TVar2.length_ = local_d8.length_;
  TVar2.ptr_ = local_d8.ptr_;
  TVar2.is_immutable_ = local_d8.is_immutable_;
  TVar2._17_7_ = local_d8._17_7_;
  TVar2.id_ = local_d8.id_;
  TVar6.length_ = local_f8.length_;
  TVar6.ptr_ = local_f8.ptr_;
  TVar6.is_immutable_ = local_f8.is_immutable_;
  TVar6._17_7_ = local_f8._17_7_;
  TVar6.id_ = local_f8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar2,TVar6,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_118,"hardest JSON");
  ctemplate::TemplateString::TemplateString
            (&local_138,"f = \'foo<>\';\r\n\t\fprint \"\\&foo = /\b\", \"foo\"");
  TVar3.length_ = local_118.length_;
  TVar3.ptr_ = local_118.ptr_;
  TVar3.is_immutable_ = local_118.is_immutable_;
  TVar3._17_7_ = local_118._17_7_;
  TVar3.id_ = local_118.id_;
  TVar7.length_ = local_138.length_;
  TVar7.ptr_ = local_138.ptr_;
  TVar7.is_immutable_ = local_138.is_immutable_;
  TVar7._17_7_ = local_138._17_7_;
  TVar7.id_ = local_138.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar3,TVar7,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_158,"html in JSON");
  ctemplate::TemplateString::TemplateString(&local_178,"<html>&nbsp;</html>");
  TVar4.length_ = local_158.length_;
  TVar4.ptr_ = local_158.ptr_;
  TVar4.is_immutable_ = local_158.is_immutable_;
  TVar4._17_7_ = local_158._17_7_;
  TVar4.id_ = local_158.id_;
  TVar8.length_ = local_178.length_;
  TVar8.ptr_ = local_178.ptr_;
  TVar8.is_immutable_ = local_178.is_immutable_;
  TVar8._17_7_ = local_178._17_7_;
  TVar8.id_ = local_178.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar4,TVar8,(TemplateModifier *)&dict);
  peer.dict_ = &dict;
  ctemplate::TemplateString::TemplateString(&local_198,"easy JSON");
  pcVar10 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_198);
  iVar9 = strcmp(pcVar10,"joo");
  if (iVar9 == 0) {
    ctemplate::TemplateString::TemplateString(&local_198,"harder JSON");
    pcVar10 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_198);
    iVar9 = strcmp(pcVar10,"f = \\\"joo\\\"; e = \'joo\';");
    if (iVar9 == 0) {
      ctemplate::TemplateString::TemplateString(&local_198,"html in JSON");
      pcVar10 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_198);
      iVar9 = strcmp(pcVar10,"\\u003Chtml\\u003E\\u0026nbsp;\\u003C\\/html\\u003E");
      if (iVar9 == 0) {
        ctemplate::TemplateString::TemplateString(&local_198,"hardest JSON");
        pcVar10 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_198);
        iVar9 = strcmp(pcVar10,
                       "f = \'foo\\u003C\\u003E\';\\r\\n\\t\\fprint \\\"\\\\\\u0026foo = \\/\\b\\\", \\\"foo\\\""
                      );
        if (iVar9 == 0) {
          ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
          return;
        }
        pcVar10 = "strcmp(peer.GetSectionValue(\"hardest JSON\"), expected) == 0";
      }
      else {
        pcVar10 = 
        "strcmp(peer.GetSectionValue(\"html in JSON\"), \"\\\\u003Chtml\\\\u003E\\\\u0026nbsp;\\\\u003C\\\\/html\\\\u003E\") == 0"
        ;
      }
    }
    else {
      pcVar10 = 
      "strcmp(peer.GetSectionValue(\"harder JSON\"), \"f = \\\\\\\"joo\\\\\\\"; \" \"e = \'joo\';\") == 0"
      ;
    }
  }
  else {
    pcVar10 = "strcmp(peer.GetSectionValue(\"easy JSON\"), \"joo\") == 0";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar10);
  exit(1);
}

Assistant:

TEST(TemplateModifiers, JsonEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestJsonEscape", NULL);
  dict.SetEscapedValue("easy JSON", "joo",
                       GOOGLE_NAMESPACE::json_escape);
  dict.SetEscapedValue("harder JSON", "f = \"joo\"; e = 'joo';",
                       GOOGLE_NAMESPACE::json_escape);
  dict.SetEscapedValue("hardest JSON",
                       "f = 'foo<>';\r\n\t\fprint \"\\&foo = /\b\", \"foo\"",
                       GOOGLE_NAMESPACE::json_escape);
  dict.SetEscapedValue("html in JSON", "<html>&nbsp;</html>",
                       GOOGLE_NAMESPACE::json_escape);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy JSON"), "joo");
  EXPECT_STREQ(peer.GetSectionValue("harder JSON"), "f = \\\"joo\\\"; "
               "e = 'joo';");
  EXPECT_STREQ(peer.GetSectionValue("html in JSON"),
               "\\u003Chtml\\u003E\\u0026nbsp;\\u003C\\/html\\u003E");
  // There's a bug in MSVC 7.1 where you can't pass a literal string
  // with more than one \" in it to a macro (!) -- see
  //    http://marc.info/?t=110853662500001&r=1&w=2
  // We work around this by assigning the string to a variable first.
  const char* expected = ("f = 'foo\\u003C\\u003E';\\r\\n\\t\\fprint \\\""
                          "\\\\\\u0026foo = \\/\\b\\\", \\\"foo\\\"");
  EXPECT_STREQ(peer.GetSectionValue("hardest JSON"), expected);
}